

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O1

UResourceBundle *
ures_getByKey_63(UResourceBundle *resB,char *inKey,UResourceBundle *fillIn,UErrorCode *status)

{
  uint table;
  bool bVar1;
  undefined4 extraout_var;
  UResourceBundle *rdata;
  Resource res;
  char *key;
  UResourceDataEntry *realData;
  int32_t t;
  
  res = 0xffffffff;
  realData = (UResourceDataEntry *)0x0;
  if ((status != (UErrorCode *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (resB == (UResourceBundle *)0x0) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      table = resB->fRes;
      if ((table & 0xf0000000) == 0x20000000 || (table & 0xe0000000) == 0x40000000) {
        key = inKey;
        res = res_getTableItemByKey_63(&resB->fResData,table,&t,&key);
        rdata = (UResourceBundle *)CONCAT44(extraout_var,res);
        if (res == 0xffffffff) {
          if (resB->fHasFallback == '\x01') {
            key = inKey;
            rdata = (UResourceBundle *)getFallbackData(resB,&key,&realData,&res,status);
            bVar1 = U_ZERO_ERROR < *status;
            if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
              rdata = init_resb_result((ResourceData *)rdata,res,key,-1,realData,resB,0,fillIn,
                                       status);
            }
            else {
              *status = U_MISSING_RESOURCE_ERROR;
            }
          }
          else {
            *status = U_MISSING_RESOURCE_ERROR;
            bVar1 = true;
          }
        }
        else {
          rdata = init_resb_result(&resB->fResData,res,key,-1,resB->fData,resB,0,fillIn,status);
          bVar1 = false;
        }
        if (!bVar1) {
          return rdata;
        }
      }
      else {
        *status = U_RESOURCE_TYPE_MISMATCH;
      }
    }
  }
  return fillIn;
}

Assistant:

U_CAPI UResourceBundle* U_EXPORT2 ures_getByKey(const UResourceBundle *resB, const char* inKey, UResourceBundle *fillIn, UErrorCode *status) {
    Resource res = RES_BOGUS;
    UResourceDataEntry *realData = NULL;
    const char *key = inKey;

    if (status==NULL || U_FAILURE(*status)) {
        return fillIn;
    }
    if(resB == NULL) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return fillIn;
    }

    int32_t type = RES_GET_TYPE(resB->fRes);
    if(URES_IS_TABLE(type)) {
        int32_t t;
        res = res_getTableItemByKey(&(resB->fResData), resB->fRes, &t, &key);
        if(res == RES_BOGUS) {
            key = inKey;
            if(resB->fHasFallback == TRUE) {
                const ResourceData *rd = getFallbackData(resB, &key, &realData, &res, status);
                if(U_SUCCESS(*status)) {
                  /* check if resB->fResPath gives the right name here */
                    return init_resb_result(rd, res, key, -1, realData, resB, 0, fillIn, status);
                } else {
                    *status = U_MISSING_RESOURCE_ERROR;
                }
            } else {
                *status = U_MISSING_RESOURCE_ERROR;
            }
        } else {
            return init_resb_result(&(resB->fResData), res, key, -1, resB->fData, resB, 0, fillIn, status);
        }
    } 
#if 0
    /* this is a kind of TODO item. If we have an array with an index table, we could do this. */
    /* not currently */
    else if(RES_GET_TYPE(resB->fRes) == URES_ARRAY && resB->fHasFallback == TRUE) {
        /* here should go a first attempt to locate the key using index table */
        const ResourceData *rd = getFallbackData(resB, &key, &realData, &res, status);
        if(U_SUCCESS(*status)) {
            return init_resb_result(rd, res, key, realData, resB, fillIn, status);
        } else {
            *status = U_MISSING_RESOURCE_ERROR;
        }
    }
#endif    
    else {
        *status = U_RESOURCE_TYPE_MISMATCH;
    }